

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratio_tester_test.cc
# Opt level: O3

void __thiscall
fizplex::RatioTesterBounded_AlphaZeroAndNoUpperIsUnbounded_Test::TestBody
          (RatioTesterBounded_AlphaZeroAndNoUpperIsUnbounded_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  RatioTestResult res;
  Message local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  RatioTestResult local_30;
  
  RatioTester::ratio_test
            (&local_30,(RatioTester *)&(this->super_RatioTesterBounded).field_0xf0,
             &(this->super_RatioTesterBounded).lp,&(this->super_RatioTesterBounded).alpha,
             &(this->super_RatioTesterBounded).beta,(this->super_RatioTesterBounded).cind,
             &(this->super_RatioTesterBounded).basic,(this->super_RatioTesterBounded).ccost);
  local_50.ss_.ptr_._0_4_ = 0;
  testing::internal::
  CmpHelperEQ<fizplex::Simplex::IterationDecision,fizplex::Simplex::IterationDecision>
            (local_40,"Simplex::IterationDecision::Unbounded","res.result",
             (IterationDecision *)&local_50,&local_30.result);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/ratio_tester_test.cc"
               ,0x17,message);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(RatioTesterBounded, AlphaZeroAndNoUpperIsUnbounded) {
  auto res = rt.ratio_test(lp, alpha, beta, cind, basic, ccost);
  EXPECT_EQ(Simplex::IterationDecision::Unbounded, res.result);
}